

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecc-ssh.c
# Opt level: O3

_Bool ec_nist_alg_and_curve_by_bits(int bits,ec_curve **curve,ssh_keyalg **alg)

{
  ssh_keyalg *psVar1;
  ec_curve *peVar2;
  
  if (bits == 0x100) {
    psVar1 = &ssh_ecdsa_nistp256;
  }
  else if (bits == 0x209) {
    psVar1 = &ssh_ecdsa_nistp521;
  }
  else {
    if (bits != 0x180) {
      return false;
    }
    psVar1 = &ssh_ecdsa_nistp384;
  }
  *alg = psVar1;
  peVar2 = (ec_curve *)(**psVar1->extra)();
  *curve = peVar2;
  return true;
}

Assistant:

bool ec_nist_alg_and_curve_by_bits(
    int bits, const struct ec_curve **curve, const ssh_keyalg **alg)
{
    switch (bits) {
      case 256: *alg = &ssh_ecdsa_nistp256; break;
      case 384: *alg = &ssh_ecdsa_nistp384; break;
      case 521: *alg = &ssh_ecdsa_nistp521; break;
      default: return false;
    }
    *curve = ((struct ecsign_extra *)(*alg)->extra)->curve();
    return true;
}